

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O0

void __thiscall
blockencodings_tests::EmptyBlockRoundTripTest::test_method(EmptyBlockRoundTripTest *this)

{
  uint256 hash;
  bool bVar1;
  undefined1 uVar2;
  long in_FS_OFFSET;
  CTxMemPool *pool;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  vtx_missing;
  DataStream stream;
  bool mutated;
  CMutableTransaction coinbase;
  CBlock block2;
  PartiallyDownloadedBlock partialBlock;
  CBlockHeaderAndShortTxIDs shortIDs2;
  CBlockHeaderAndShortTxIDs shortIDs;
  FastRandomContext rand_ctx;
  CBlock block;
  char *in_stack_fffffffffffff728;
  CMutableTransaction *in_stack_fffffffffffff730;
  CBlockHeaderAndShortTxIDs *obj;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffff738;
  char *this_00;
  uint256 *in_stack_fffffffffffff740;
  PartiallyDownloadedBlock *this_01;
  FastRandomContext *in_stack_fffffffffffff748;
  CTxMemPool *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff758;
  uint in_stack_fffffffffffff75c;
  lazy_ostream *in_stack_fffffffffffff760;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *in_stack_fffffffffffff768;
  unit_test_log_t *puVar3;
  bool *in_stack_fffffffffffff780;
  undefined7 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78f;
  undefined8 in_stack_fffffffffffff790;
  uint64_t in_stack_fffffffffffff798;
  undefined7 in_stack_fffffffffffff7a0;
  undefined1 in_stack_fffffffffffff7a7;
  CBlockHeaderAndShortTxIDs *in_stack_fffffffffffff7a8;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *vtx_missing_00;
  CBlock *in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff83c;
  lazy_ostream local_790 [2];
  assertion_result local_770 [2];
  undefined1 local_738 [16];
  undefined1 local_728 [56];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffff910;
  CBlockHeaderAndShortTxIDs *in_stack_fffffffffffff918;
  PartiallyDownloadedBlock *in_stack_fffffffffffff920;
  undefined1 local_6d8 [64];
  const_string local_698 [2];
  lazy_ostream local_678 [2];
  assertion_result local_658 [3];
  const_string local_608 [2];
  lazy_ostream local_5e8 [2];
  assertion_result local_5c8 [2];
  const_string local_590 [2];
  lazy_ostream local_570 [2];
  assertion_result local_550 [2];
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  byte local_4f1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_4f0 [4];
  undefined1 local_488 [160];
  undefined1 local_3e8 [616];
  CChainParams *local_180;
  CBlockHeaderAndShortTxIDs *pCStack_178;
  DataStream *local_170;
  PartiallyDownloadedBlock *pPStack_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined8 local_54;
  undefined8 local_4c;
  undefined8 local_44;
  undefined8 local_3c;
  undefined4 local_30;
  int local_2c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
            (in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff760,in_stack_fffffffffffff75c,
             (char *)in_stack_fffffffffffff750,(char *)in_stack_fffffffffffff748);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffff738);
  BuildTransactionTestCase();
  CBlock::CBlock((CBlock *)in_stack_fffffffffffff748);
  uint256::uint256((uint256 *)in_stack_fffffffffffff728,'\0');
  FastRandomContext::FastRandomContext(in_stack_fffffffffffff748,in_stack_fffffffffffff740);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffff748,(size_type)in_stack_fffffffffffff740);
  ::MakeTransactionRef<CMutableTransaction>(in_stack_fffffffffffff730);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[](in_stack_fffffffffffff738,(size_type)in_stack_fffffffffffff730);
  vtx_missing_00 = local_4f0;
  std::shared_ptr<const_CTransaction>::operator=
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff738,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff730);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff728);
  local_78 = 0x2a;
  RandomMixin<FastRandomContext>::rand256
            ((RandomMixin<FastRandomContext> *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  local_64 = local_130;
  uStack_5c = uStack_128;
  local_74 = local_140;
  uStack_6c = uStack_138;
  local_30 = 0x207fffff;
  BlockMerkleRoot((CBlock *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
                  in_stack_fffffffffffff780);
  local_54 = local_160;
  local_4c = local_158;
  local_44 = local_150;
  local_3c = local_148;
  if (((local_4f1 ^ 0xff) & 1) == 0) {
    __assert_fail("!mutated",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
                  ,0x11c,"void blockencodings_tests::EmptyBlockRoundTripTest::test_method()");
  }
  while( true ) {
    CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffff748);
    Params();
    CChainParams::GetConsensus((CChainParams *)in_stack_fffffffffffff728);
    hash.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_fffffffffffff798;
    hash.super_base_blob<256U>.m_data._M_elems[9] = (char)(in_stack_fffffffffffff798 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[10] = (char)(in_stack_fffffffffffff798 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = (char)(in_stack_fffffffffffff798 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)(in_stack_fffffffffffff798 >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = (char)(in_stack_fffffffffffff798 >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = (char)(in_stack_fffffffffffff798 >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = (char)(in_stack_fffffffffffff798 >> 0x38);
    hash.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_fffffffffffff790;
    hash.super_base_blob<256U>.m_data._M_elems[1] = (char)((ulong)in_stack_fffffffffffff790 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[2] = (char)((ulong)in_stack_fffffffffffff790 >> 0x10)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[3] = (char)((ulong)in_stack_fffffffffffff790 >> 0x18)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[4] = (char)((ulong)in_stack_fffffffffffff790 >> 0x20)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[5] = (char)((ulong)in_stack_fffffffffffff790 >> 0x28)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[6] = (char)((ulong)in_stack_fffffffffffff790 >> 0x30)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[7] = (char)((ulong)in_stack_fffffffffffff790 >> 0x38)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_stack_fffffffffffff7a0;
    hash.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((uint7)in_stack_fffffffffffff7a0 >> 8)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         (char)((uint7)in_stack_fffffffffffff7a0 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         (char)((uint7)in_stack_fffffffffffff7a0 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         (char)((uint7)in_stack_fffffffffffff7a0 >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         (char)((uint7)in_stack_fffffffffffff7a0 >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         (char)((uint7)in_stack_fffffffffffff7a0 >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[0x17] = in_stack_fffffffffffff7a7;
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_fffffffffffff7a8;
    in_stack_fffffffffffff728 = (char *)local_180;
    obj = pCStack_178;
    this_00 = (char *)local_170;
    this_01 = pPStack_168;
    bVar1 = CheckProofOfWork(hash,in_stack_fffffffffffff75c,(Params *)in_stack_fffffffffffff750);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_2c = local_2c + 1;
  }
  FastRandomContext::rand64((FastRandomContext *)this_01);
  CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
            (in_stack_fffffffffffff7a8,
             (CBlock *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0),
             in_stack_fffffffffffff798);
  local_508 = 0;
  uStack_500 = 0;
  local_518 = 0;
  uStack_510 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff728);
  DataStream::operator<<((DataStream *)this_00,obj);
  CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
            ((CBlockHeaderAndShortTxIDs *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  DataStream::operator>>((DataStream *)this_00,obj);
  PartiallyDownloadedBlock::PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),in_stack_fffffffffffff750
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff768,
               (const_string *)in_stack_fffffffffffff760,
               CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
               (const_string *)in_stack_fffffffffffff750);
    PartiallyDownloadedBlock::InitData
              (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_00,SUB81((ulong)obj >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    boost::unit_test::operator<<
              ((lazy_ostream *)obj,(basic_cstring<const_char> *)in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    in_stack_fffffffffffff728 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_550,local_570,local_590,0x12a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff728);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff728);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff768,
               (const_string *)in_stack_fffffffffffff760,
               CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
               (const_string *)in_stack_fffffffffffff750);
    PartiallyDownloadedBlock::IsTxAvailable(this_01,(size_t)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_00,SUB81((ulong)obj >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    boost::unit_test::operator<<
              ((lazy_ostream *)obj,(basic_cstring<const_char> *)in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    in_stack_fffffffffffff728 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5c8,local_5e8,local_608,299,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff728);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff728);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CBlock::CBlock((CBlock *)in_stack_fffffffffffff748);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffff728);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff768,
               (const_string *)in_stack_fffffffffffff760,
               CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
               (const_string *)in_stack_fffffffffffff750);
    PartiallyDownloadedBlock::FillBlock
              ((PartiallyDownloadedBlock *)
               CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
               in_stack_fffffffffffff830,vtx_missing_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_00,SUB81((ulong)obj >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    boost::unit_test::operator<<
              ((lazy_ostream *)obj,(basic_cstring<const_char> *)in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    in_stack_fffffffffffff728 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_658,local_678,local_698,0x12f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff728);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff728);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff768,
               (const_string *)in_stack_fffffffffffff760,
               CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
               (const_string *)in_stack_fffffffffffff750);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)obj,(char (*) [1])in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffff748);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)obj);
    CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffff748);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)obj);
    this_00 = "block2.GetHash().ToString()";
    obj = (CBlockHeaderAndShortTxIDs *)(local_488 + 0x60);
    in_stack_fffffffffffff728 = "block.GetHash().ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_6d8,&stack0xfffffffffffff918,0x130,1,2,local_3e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff728);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff728);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff728);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff768,
               (const_string *)in_stack_fffffffffffff760,
               CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
               (const_string *)in_stack_fffffffffffff750);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)obj,(char (*) [1])in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)obj);
    BlockMerkleRoot((CBlock *)CONCAT17(uVar2,in_stack_fffffffffffff788),(bool *)puVar3);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)obj);
    this_00 = "BlockMerkleRoot(block2, &mutated).ToString()";
    obj = (CBlockHeaderAndShortTxIDs *)local_488;
    in_stack_fffffffffffff728 = "block.hashMerkleRoot.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_728,local_738,0x131,1,2,local_488 + 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff728);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff728);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff728);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (puVar3,(const_string *)in_stack_fffffffffffff760,
               CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
               (const_string *)in_stack_fffffffffffff750);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_00,SUB81((ulong)obj >> 0x38,0));
    in_stack_fffffffffffff760 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    boost::unit_test::operator<<
              ((lazy_ostream *)obj,(basic_cstring<const_char> *)in_stack_fffffffffffff728);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)obj,
               (unsigned_long)in_stack_fffffffffffff728);
    in_stack_fffffffffffff728 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_770,local_790,(const_string *)&stack0xfffffffffffff850,0x132,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff728);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff728);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff75c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff75c);
  } while (bVar1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)this_00);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff728);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)in_stack_fffffffffffff728);
  CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs
            ((CBlockHeaderAndShortTxIDs *)in_stack_fffffffffffff728);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff728);
  CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs
            ((CBlockHeaderAndShortTxIDs *)in_stack_fffffffffffff728);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffff728);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff728);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff728);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(EmptyBlockRoundTripTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    CMutableTransaction coinbase = BuildTransactionTestCase();

    CBlock block;
    auto rand_ctx(FastRandomContext(uint256{42}));
    block.vtx.resize(1);
    block.vtx[0] = MakeTransactionRef(std::move(coinbase));
    block.nVersion = 42;
    block.hashPrevBlock = rand_ctx.rand256();
    block.nBits = 0x207fffff;

    bool mutated;
    block.hashMerkleRoot = BlockMerkleRoot(block, &mutated);
    assert(!mutated);
    while (!CheckProofOfWork(block.GetHash(), block.nBits, Params().GetConsensus())) ++block.nNonce;

    // Test simple header round-trip with only coinbase
    {
        CBlockHeaderAndShortTxIDs shortIDs{block, rand_ctx.rand64()};

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK(partialBlock.IsTxAvailable(0));

        CBlock block2;
        std::vector<CTransactionRef> vtx_missing;
        BOOST_CHECK(partialBlock.FillBlock(block2, vtx_missing) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block2.GetHash().ToString());
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block2, &mutated).ToString());
        BOOST_CHECK(!mutated);
    }
}